

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

char32_t __thiscall pegmatite::Context::symbol(Context *this)

{
  ulong uVar1;
  Input *this_00;
  ulong n;
  int iVar2;
  char32_t cVar3;
  undefined4 extraout_var;
  Index IVar4;
  long lStack_28;
  
  this_00 = (this->position).it.buffer;
  if ((this_00 == (this->finish).buffer) && ((this->position).it.idx == (this->finish).idx)) {
    __assert_fail("!end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/parser.cc"
                  ,0xf0,"char32_t pegmatite::Context::symbol() const");
  }
  n = (this->position).it.idx;
  lStack_28 = n - this_00->buffer_start;
  if (this_00->buffer_start <= n) {
    if (this_00->buffer_end <= n) {
      cVar3 = Input::slowCharacterLookup(this_00,n);
      return cVar3;
    }
    return this_00->buffer[lStack_28];
  }
  iVar2 = (*this_00->_vptr_Input[1])();
  cVar3 = L'\0';
  if (n < CONCAT44(extraout_var,iVar2)) {
    cVar3 = L'\0';
    IVar4 = 0;
    if (0x7f < n) {
      IVar4 = n - 0x80;
    }
    if (this_00->buffer_start <= n) {
      IVar4 = n;
    }
    this_00->buffer_start = IVar4;
    lStack_28 = 0x200;
    this_00->buffer = this_00->local_buffer;
    iVar2 = (**this_00->_vptr_Input)(this_00,IVar4,&lStack_28,&this_00->buffer);
    if ((char)iVar2 == '\0') {
      this_00->buffer_end = 0;
    }
    else {
      uVar1 = this_00->buffer_start;
      this_00->buffer_end = lStack_28 + uVar1;
      if ((n < uVar1) || (lStack_28 + uVar1 <= n)) {
        __assert_fail("(n >= buffer_start) && (n < buffer_end)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/parser.cc"
                      ,0x587,"char32_t pegmatite::Input::slowCharacterLookup(Index)");
      }
      cVar3 = this_00->buffer[n - uVar1];
    }
  }
  return cVar3;
}

Assistant:

char32_t symbol() const
	{
		assert(!end());
		return *position.it;
	}